

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int VmJsonArrayDecoder(jx9_context *pCtx,jx9_value *pKey,jx9_value *pWorker,void *pUserData)

{
  jx9_value *pArray;
  
  if ((*(byte *)((long)pUserData + 8) & 0x40) != 0) {
    HashmapInsert(*pUserData,pKey,pWorker);
  }
  return 0;
}

Assistant:

JX9_PRIVATE int jx9_array_add_elem(jx9_value *pArray, jx9_value *pKey, jx9_value *pValue)
{
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Perform the insertion */
	rc = jx9HashmapInsert((jx9_hashmap *)pArray->x.pOther, &(*pKey), &(*pValue));
	return rc;
}